

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * DumpCTestConfiguration(Value *__return_storage_ptr__,cmake *cm,string *config)

{
  Value *pVVar1;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmake *cm_local;
  Value *result;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)cm;
  cm_local = (cmake *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,local_20);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  DumpCTestProjectList(&local_88,(cmake *)config_local,local_20);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,&kPROJECTS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_88);
  Json::Value::~Value(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpCTestConfiguration(const cmake* cm,
                                          const std::string& config)
{
  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = config;

  result[kPROJECTS_KEY] = DumpCTestProjectList(cm, config);

  return result;
}